

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

void Gia_Sim2SimulateCo(Gia_Sim2_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  int local_2c;
  int w;
  uint *pInfo0;
  uint *pInfo;
  Gia_Obj_t *pObj_local;
  Gia_Sim2_t *p_local;
  
  iVar1 = Gia_ObjValue(pObj);
  puVar2 = Gia_Sim2Data(p,iVar1);
  iVar1 = Gia_ObjValue(pObj);
  iVar1 = Gia_ObjFaninId0(pObj,iVar1);
  puVar3 = Gia_Sim2Data(p,iVar1);
  iVar1 = Gia_ObjFaninC0(pObj);
  if (iVar1 == 0) {
    local_2c = p->nWords;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      puVar2[local_2c] = puVar3[local_2c];
    }
  }
  else {
    local_2c = p->nWords;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      puVar2[local_2c] = puVar3[local_2c] ^ 0xffffffff;
    }
  }
  return;
}

Assistant:

static inline void Gia_Sim2SimulateCo( Gia_Sim2_t * p, Gia_Obj_t * pObj )
{
    unsigned * pInfo  = Gia_Sim2Data( p, Gia_ObjValue(pObj) );
    unsigned * pInfo0 = Gia_Sim2Data( p, Gia_ObjFaninId0(pObj, Gia_ObjValue(pObj)) );
    int w;
    if ( Gia_ObjFaninC0(pObj) )
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] = ~pInfo0[w];
    else 
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] = pInfo0[w];
}